

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi__pic_info(stbi__context *s,int *x,int *y,int *comp)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  stbi_uc *psVar5;
  byte *pbVar6;
  uint unaff_R13D;
  byte bVar7;
  bool bVar8;
  
  iVar3 = stbi__pic_is4(s,anon_var_dwarf_1e2a60);
  if (iVar3 == 0) goto LAB_00167aee;
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00167a71:
    s->img_buffer = s->img_buffer + 0x58;
  }
  else {
    iVar3 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (0x57 < iVar3) goto LAB_00167a71;
    s->img_buffer = s->img_buffer_end;
    (*(s->io).skip)(s->io_user_data,0x58 - iVar3);
  }
  iVar3 = stbi__get16be(s);
  if (x != (int *)0x0) {
    *x = iVar3;
  }
  iVar4 = stbi__get16be(s);
  if (y != (int *)0x0) {
    *y = iVar4;
    iVar4 = iVar3;
  }
  if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00167aba:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_00167aee;
  }
  else {
    iVar3 = (*(s->io).eof)(s->io_user_data);
    if (iVar3 != 0) {
      if (s->read_from_callbacks == 0) goto LAB_00167aee;
      goto LAB_00167aba;
    }
  }
  iVar3 = iVar4;
  if (x != (int *)0x0) {
    iVar3 = *x;
  }
  if (iVar3 != 0) {
    if (y != (int *)0x0) {
      iVar4 = *y;
    }
    if ((int)(0x10000000 / (long)iVar3) < iVar4) {
LAB_00167aee:
      s->img_buffer = s->img_buffer_original;
      s->img_buffer_end = s->img_buffer_original_end;
      return 0;
    }
  }
  if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
    iVar3 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
    if (iVar3 < 8) {
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,8 - iVar3);
      goto LAB_00167b53;
    }
  }
  s->img_buffer = s->img_buffer + 8;
LAB_00167b53:
  bVar7 = 0;
  iVar3 = 0;
  do {
    if (iVar3 == 10) {
LAB_00167c90:
      bVar1 = false;
    }
    else {
      pbVar6 = s->img_buffer;
      if (pbVar6 < s->img_buffer_end) {
LAB_00167b8f:
        s->img_buffer = pbVar6 + 1;
        unaff_R13D = (uint)*pbVar6;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          pbVar6 = s->img_buffer;
          goto LAB_00167b8f;
        }
        unaff_R13D = 0;
      }
      psVar5 = s->img_buffer;
      if (psVar5 < s->img_buffer_end) {
LAB_00167bc8:
        s->img_buffer = psVar5 + 1;
        bVar8 = *psVar5 == '\b';
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          psVar5 = s->img_buffer;
          goto LAB_00167bc8;
        }
        bVar8 = false;
      }
      psVar5 = s->img_buffer;
      if (psVar5 < s->img_buffer_end) {
LAB_00167bff:
        s->img_buffer = psVar5 + 1;
      }
      else if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        psVar5 = s->img_buffer;
        goto LAB_00167bff;
      }
      pbVar6 = s->img_buffer;
      if (pbVar6 < s->img_buffer_end) {
LAB_00167c33:
        s->img_buffer = pbVar6 + 1;
        bVar2 = *pbVar6;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          pbVar6 = s->img_buffer;
          goto LAB_00167c33;
        }
        bVar2 = 0;
      }
      iVar3 = iVar3 + 1;
      bVar7 = bVar7 | bVar2;
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar4 = (*(s->io).eof)(s->io_user_data);
        if (iVar4 == 0) {
          bVar1 = true;
          if (bVar8) goto LAB_00167c92;
        }
        else if (s->read_from_callbacks != 0) goto LAB_00167c61;
LAB_00167c80:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        goto LAB_00167c90;
      }
LAB_00167c61:
      if ((s->img_buffer_end <= s->img_buffer) || (bVar1 = true, !bVar8)) goto LAB_00167c80;
    }
LAB_00167c92:
    if (!bVar1) {
      return 0;
    }
    if (unaff_R13D == 0) {
      if (comp != (int *)0x0) {
        *comp = 4 - (uint)((bVar7 & 0x10) == 0);
      }
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__pic_info(stbi__context *s, int *x, int *y, int *comp)
{
   int act_comp=0,num_packets=0,chained,dummy;
   stbi__pic_packet packets[10];

   if (!x) x = &dummy;
   if (!y) y = &dummy;
   if (!comp) comp = &dummy;

   if (!stbi__pic_is4(s,"\x53\x80\xF6\x34")) {
      stbi__rewind(s);
      return 0;
   }

   stbi__skip(s, 88);

   *x = stbi__get16be(s);
   *y = stbi__get16be(s);
   if (stbi__at_eof(s)) {
      stbi__rewind( s);
      return 0;
   }
   if ( (*x) != 0 && (1 << 28) / (*x) < (*y)) {
      stbi__rewind( s );
      return 0;
   }

   stbi__skip(s, 8);

   do {
      stbi__pic_packet *packet;

      if (num_packets==sizeof(packets)/sizeof(packets[0]))
         return 0;

      packet = &packets[num_packets++];
      chained = stbi__get8(s);
      packet->size    = stbi__get8(s);
      packet->type    = stbi__get8(s);
      packet->channel = stbi__get8(s);
      act_comp |= packet->channel;

      if (stbi__at_eof(s)) {
          stbi__rewind( s );
          return 0;
      }
      if (packet->size != 8) {
          stbi__rewind( s );
          return 0;
      }
   } while (chained);

   *comp = (act_comp & 0x10 ? 4 : 3);

   return 1;
}